

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  long in_RSI;
  int in_EDI;
  lattice grid;
  int out;
  char *endptr;
  int i;
  int output;
  char *scene;
  char *imageFile;
  char *paramFile;
  double **P;
  double **V;
  double **U;
  int rank;
  int sizeX;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff64;
  char *local_58;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  long local_40;
  long local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int local_14;
  long local_10;
  int local_8 [2];
  
  local_8[1] = 0;
  local_10 = in_RSI;
  local_8[0] = in_EDI;
  MPI_Init(local_8,&local_10);
  if (local_8[0] < 3) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_14);
    if (local_14 == 0) {
      printf(
            "Usage: simulator <scene>\n                 [-p\"parameter_file\"]\n                 [-i\"image_file]\"\n                 [number_of_frames]\n"
            );
      printf(
            "When specifying both an image and a parameter file, the sizes specified from the image take precedence!\n"
            );
    }
    MPI_Finalize();
  }
  else {
    local_20 = 0;
    local_28 = 0;
    local_30 = 0;
    local_38 = 0;
    local_40 = 0;
    local_48 = 0;
    local_4c = 0;
    for (local_50 = 1; local_50 < local_8[0]; local_50 = local_50 + 1) {
      if (**(char **)(local_10 + (long)local_50 * 8) == '-') {
        cVar1 = *(char *)(*(long *)(local_10 + (long)local_50 * 8) + 1);
        if (cVar1 == 'i') {
          local_40 = *(long *)(local_10 + (long)local_50 * 8) + 2;
        }
        else if (cVar1 == 'p') {
          local_38 = *(long *)(local_10 + (long)local_50 * 8) + 2;
        }
        else if (cVar1 == 'v') {
          local_4c = local_4c | 1;
        }
        else {
          printf("Unrecognized option %s\n",*(undefined8 *)(local_10 + (long)local_50 * 8));
        }
      }
      else {
        local_58 = "";
        lVar2 = strtol(*(char **)(local_10 + (long)local_50 * 8),&local_58,0);
        if (*local_58 == '\0') {
          local_4c = (int)lVar2 << 4 | local_4c;
        }
        else {
          local_48 = *(undefined8 *)(local_10 + (long)local_50 * 8);
        }
      }
    }
    lVar2 = local_40;
    uVar3 = local_4c;
    runSimulation((double ***)grid._40_8_,(double ***)grid._32_8_,(double ***)grid._24_8_,
                  (char *)grid._16_8_,(char *)grid.dely,endptr,i);
    sizeX = (int)((ulong)lVar2 >> 0x20);
    destroy2Dfield((void **)CONCAT44(in_stack_ffffffffffffff64,uVar3),sizeX);
    destroy2Dfield((void **)CONCAT44(in_stack_ffffffffffffff64,uVar3),sizeX);
    destroy2Dfield((void **)CONCAT44(in_stack_ffffffffffffff64,uVar3),sizeX);
    MPI_Finalize();
  }
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
	MPI_Init(&argc,&argv);
	if (argc < 3)
	{
		int rank;
		MPI_Comm_rank(MPI_COMM_WORLD,&rank);
		if (rank == 0)
		{
			printf("Usage: simulator <scene>\n"
					"                 [-p\"parameter_file\"]\n"
					"                 [-i\"image_file]\"\n"
					"                 [number_of_frames]\n");
			printf("When specifying both an image and a parameter file, "
					"the sizes specified from the image take precedence!\n");
		}
		MPI_Finalize();
		return 0;
	}
	REAL **U = NULL, **V = NULL, **P = NULL;
	char *paramFile = NULL;
	char *imageFile = NULL;
	char *scene = NULL;
	int output = SILENT;

	for (int i = 1; i < argc; i++)
	{
		if (argv[i][0] != '-')
		{
			char *endptr = "\0";
			int out = strtol(argv[i],&endptr,0);
			if (endptr[0] == '\0')
				output |= out*OUTPUT;
			else
				scene = argv[i];
			continue;
		}
		switch (argv[i][1])
		{
			case 'v':
				output |= PRINT;
				break;
			case 'p':
				paramFile = argv[i]+2;
				break;
			case 'i':
				imageFile = argv[i]+2;
				break;
			default:
				printf("Unrecognized option %s\n",argv[i]);
				break;
		}
	}
	lattice grid = runSimulation(&U,&V,&P,scene,paramFile,imageFile,output);
	//writeHorizontal(U,grid.deli,grid.delj,"hor.dat");
	/* Destroy simulated grids */
	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	MPI_Finalize();
	return 0;
}